

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzD.cpp
# Opt level: O2

void __thiscall chrono::fea::ChNodeFEAxyzD::SetNoSpeedNoAcceleration(ChNodeFEAxyzD *this)

{
  double dVar1;
  
  ChNodeFEAxyz::SetNoSpeedNoAcceleration(&this->super_ChNodeFEAxyz);
  dVar1 = DAT_011dd3e0;
  if (this != (ChNodeFEAxyzD *)Q_ROTATE_Y_TO_Z) {
    (this->D_dt).m_data[0] = VNULL;
    (this->D_dt).m_data[1] = dVar1;
    (this->D_dt).m_data[2] = DAT_011dd3e8;
  }
  dVar1 = DAT_011dd3e0;
  if (this != (ChNodeFEAxyzD *)&DAT_011dd2b8) {
    (this->D_dtdt).m_data[0] = VNULL;
    (this->D_dtdt).m_data[1] = dVar1;
    (this->D_dtdt).m_data[2] = DAT_011dd3e8;
  }
  return;
}

Assistant:

void ChNodeFEAxyzD::SetNoSpeedNoAcceleration() {
    ChNodeFEAxyz::SetNoSpeedNoAcceleration();

    D_dt = VNULL;
    D_dtdt = VNULL;
}